

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuaternion.h
# Opt level: O0

btQuaternion __thiscall btQuaternion::inverse(btQuaternion *this)

{
  btQuadWord bVar1;
  btScalar *in_RDI;
  undefined4 in_stack_ffffffffffffffd8;
  btQuaternion *in_stack_fffffffffffffff0;
  undefined8 local_8;
  
  btQuaternion(in_stack_fffffffffffffff0,in_RDI,
               (btScalar *)(CONCAT44(*in_RDI,in_RDI[1]) ^ 0x8000000080000000),
               (btScalar *)(CONCAT44(in_RDI[2],in_stack_ffffffffffffffd8) ^ 0x8000000000000000),
               (btScalar *)0x197211);
  bVar1.m_floats._8_8_ = local_8;
  bVar1.m_floats._0_8_ = in_stack_fffffffffffffff0;
  return (btQuadWord)(btQuadWord)bVar1.m_floats;
}

Assistant:

btQuaternion inverse() const
	{
#if defined (BT_USE_SSE_IN_API) && defined (BT_USE_SSE)
		return btQuaternion(_mm_xor_ps(mVec128, vQInv));
#elif defined(BT_USE_NEON)
        return btQuaternion((btSimdFloat4)veorq_s32((int32x4_t)mVec128, (int32x4_t)vQInv));
#else	
		return btQuaternion(-m_floats[0], -m_floats[1], -m_floats[2], m_floats[3]);
#endif
	}